

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O0

void __thiscall Fl_Help_Dialog::Fl_Help_Dialog(Fl_Help_Dialog *this)

{
  Fl_Double_Window *this_00;
  Fl_Group *pFVar1;
  Fl_Button *pFVar2;
  Fl_Group *pFVar3;
  Fl_Input *this_01;
  Fl_Widget *o_00;
  Fl_Help_View *this_02;
  Fl_Box *o_2;
  Fl_Group *o_1;
  Fl_Group *o;
  Fl_Help_Dialog *this_local;
  
  this_00 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(this_00,0x212,0x181,"Help Dialog");
  this->window_ = this_00;
  Fl_Widget::user_data((Fl_Widget *)this->window_,this);
  pFVar1 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar1,10,10,0x1ff,0x19,(char *)0x0);
  pFVar2 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar2,10,10,0x19,0x19,"@<-");
  this->back_ = pFVar2;
  Fl_Widget::tooltip(&this->back_->super_Fl_Widget,"Show the previous help page.");
  Fl_Button::shortcut(this->back_,0xff51);
  Fl_Widget::labelcolor(&this->back_->super_Fl_Widget,2);
  Fl_Widget::callback(&this->back_->super_Fl_Widget,cb_back_);
  pFVar2 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar2,0x2d,10,0x19,0x19,"@->");
  this->forward_ = pFVar2;
  Fl_Widget::tooltip(&this->forward_->super_Fl_Widget,"Show the next help page.");
  Fl_Button::shortcut(this->forward_,0xff53);
  Fl_Widget::labelcolor(&this->forward_->super_Fl_Widget,2);
  Fl_Widget::callback(&this->forward_->super_Fl_Widget,cb_forward_);
  pFVar2 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar2,0x50,10,0x19,0x19,"F");
  this->smaller_ = pFVar2;
  Fl_Widget::tooltip(&this->smaller_->super_Fl_Widget,"Make the help text smaller.");
  Fl_Widget::labelfont(&this->smaller_->super_Fl_Widget,1);
  Fl_Widget::labelsize(&this->smaller_->super_Fl_Widget,10);
  Fl_Widget::callback(&this->smaller_->super_Fl_Widget,cb_smaller_);
  pFVar2 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar2,0x73,10,0x19,0x19,"F");
  this->larger_ = pFVar2;
  Fl_Widget::tooltip(&this->larger_->super_Fl_Widget,"Make the help text larger.");
  Fl_Widget::labelfont(&this->larger_->super_Fl_Widget,1);
  Fl_Widget::labelsize(&this->larger_->super_Fl_Widget,0x10);
  Fl_Widget::callback(&this->larger_->super_Fl_Widget,cb_larger_);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,0x15e,10,0xab,0x19,(char *)0x0);
  Fl_Widget::box((Fl_Widget *)pFVar3,FL_DOWN_BOX);
  Fl_Widget::color((Fl_Widget *)pFVar3,7);
  this_01 = (Fl_Input *)operator_new(200);
  Fl_Input::Fl_Input(this_01,0x177,0xc,0x8f,0x15,"@search");
  this->find_ = this_01;
  Fl_Widget::tooltip((Fl_Widget *)this->find_,"find text in document");
  Fl_Widget::box((Fl_Widget *)this->find_,FL_FLAT_BOX);
  Fl_Widget::labelsize((Fl_Widget *)this->find_,0xd);
  Fl_Input_::textfont(&this->find_->super_Fl_Input_,4);
  Fl_Widget::callback((Fl_Widget *)this->find_,cb_find_);
  Fl_Widget::when((Fl_Widget *)this->find_,'\n');
  Fl_Group::end(pFVar3);
  o_00 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)o_00,0x96,10,0xbe,0x19,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,o_00);
  Fl_Group::end(pFVar1);
  this_02 = (Fl_Help_View *)operator_new(0x1b38);
  Fl_Help_View::Fl_Help_View(this_02,10,0x2d,0x1fe,0x14a,(char *)0x0);
  this->view_ = this_02;
  Fl_Widget::box((Fl_Widget *)this->view_,FL_DOWN_BOX);
  Fl_Widget::callback((Fl_Widget *)this->view_,cb_view_);
  pFVar1 = Fl_Group::current();
  Fl_Group::resizable(pFVar1,(Fl_Widget *)this->view_);
  Fl_Window::size_range(&this->window_->super_Fl_Window,0x104,0x96,0,0,0,0,0);
  Fl_Group::end((Fl_Group *)this->window_);
  Fl_Widget::deactivate(&this->back_->super_Fl_Widget);
  Fl_Widget::deactivate(&this->forward_->super_Fl_Widget);
  this->index_ = -1;
  this->max_ = 0;
  this->find_pos_ = 0;
  fl_register_images();
  return;
}

Assistant:

Fl_Help_Dialog::Fl_Help_Dialog() {
  { window_ = new Fl_Double_Window(530, 385, "Help Dialog");
    window_->user_data((void*)(this));
    { Fl_Group* o = new Fl_Group(10, 10, 511, 25);
      { back_ = new Fl_Button(10, 10, 25, 25, "@<-");
        back_->tooltip("Show the previous help page.");
        back_->shortcut(0xff51);
        back_->labelcolor((Fl_Color)2);
        back_->callback((Fl_Callback*)cb_back_);
      } // Fl_Button* back_
      { forward_ = new Fl_Button(45, 10, 25, 25, "@->");
        forward_->tooltip("Show the next help page.");
        forward_->shortcut(0xff53);
        forward_->labelcolor((Fl_Color)2);
        forward_->callback((Fl_Callback*)cb_forward_);
      } // Fl_Button* forward_
      { smaller_ = new Fl_Button(80, 10, 25, 25, "F");
        smaller_->tooltip("Make the help text smaller.");
        smaller_->labelfont(1);
        smaller_->labelsize(10);
        smaller_->callback((Fl_Callback*)cb_smaller_);
      } // Fl_Button* smaller_
      { larger_ = new Fl_Button(115, 10, 25, 25, "F");
        larger_->tooltip("Make the help text larger.");
        larger_->labelfont(1);
        larger_->labelsize(16);
        larger_->callback((Fl_Callback*)cb_larger_);
      } // Fl_Button* larger_
      { Fl_Group* o = new Fl_Group(350, 10, 171, 25);
        o->box(FL_DOWN_BOX);
        o->color(FL_BACKGROUND2_COLOR);
        { find_ = new Fl_Input(375, 12, 143, 21, "@search");
          find_->tooltip("find text in document");
          find_->box(FL_FLAT_BOX);
          find_->labelsize(13);
          find_->textfont(4);
          find_->callback((Fl_Callback*)cb_find_);
          find_->when(FL_WHEN_ENTER_KEY_ALWAYS);
        } // Fl_Input* find_
        o->end();
      } // Fl_Group* o
      { Fl_Box* o = new Fl_Box(150, 10, 190, 25);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { view_ = new Fl_Help_View(10, 45, 510, 330);
      view_->box(FL_DOWN_BOX);
      view_->callback((Fl_Callback*)cb_view_);
      Fl_Group::current()->resizable(view_);
    } // Fl_Help_View* view_
    window_->size_range(260, 150);
    window_->end();
  } // Fl_Double_Window* window_
  back_->deactivate();
  forward_->deactivate();
  
  index_    = -1;
  max_      = 0;
  find_pos_ = 0;
  
  fl_register_images();
}